

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_end(nk_context *ctx)

{
  long in_RDI;
  nk_panel *in_stack_00000008;
  nk_context *in_stack_00000010;
  nk_context *in_stack_000001f0;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x3fc8) != 0)) {
    if ((*(uint *)(*(long *)(in_RDI + 0x3fc8) + 0x48) & 0x1000) == 0) {
      nk_panel_end(in_stack_000001f0);
      nk_free_panel(in_stack_00000010,in_stack_00000008);
      *(undefined8 *)(in_RDI + 0x3fc8) = 0;
    }
    else {
      *(undefined8 *)(in_RDI + 0x3fc8) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return;
    if (ctx->current->flags & NK_WINDOW_HIDDEN) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}